

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitLoadInstance
          (ByteCodeGenerator *this,Symbol *sym,IdentPtr pid,RegSlot *pThisLocation,
          RegSlot *pInstLocation,FuncInfo *funcInfo)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  PropertyId R0;
  FuncInfo *pFVar4;
  bool bVar5;
  ScopeType SVar6;
  DynamicLoadKind DVar7;
  uint32 uVar8;
  uint uVar9;
  ByteCodeLabel labelID;
  RegSlot RVar10;
  int iVar11;
  undefined4 *puVar12;
  FuncInfo *pFVar13;
  Scope *pSVar14;
  Type *pTVar15;
  PropertyId local_140;
  PropertyId local_108;
  Scope *local_d0;
  int local_bc;
  RegSlot tmpReg;
  int i;
  ByteCodeLabel doneLabel;
  PropertyId propertyId_1;
  uint32 frameDisplayIndex_1;
  uint32 frameDisplayIndex;
  PropertyIdIndexType propertyIndex;
  PropertyId propertyId;
  DynamicLoadRecord rec;
  undefined1 local_88 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  Scope *symScope;
  Scope *scope;
  PropertyId envIndex;
  RegSlot instLocation;
  RegSlot thisLocation;
  RegSlot scopeLocation;
  FuncInfo *funcInfo_local;
  RegSlot *pInstLocation_local;
  RegSlot *pThisLocation_local;
  IdentPtr pid_local;
  Symbol *sym_local;
  ByteCodeGenerator *this_local;
  
  instLocation = 0xffffffff;
  envIndex = *pThisLocation;
  scope._4_4_ = *pInstLocation;
  scope._0_4_ = -1;
  symScope = (Scope *)0x0;
  _thisLocation = funcInfo;
  funcInfo_local = (FuncInfo *)pInstLocation;
  pInstLocation_local = pThisLocation;
  pThisLocation_local = (RegSlot *)pid;
  pid_local = (IdentPtr)sym;
  sym_local = (Symbol *)this;
  if (sym == (Symbol *)0x0) {
    local_d0 = this->globalScope;
  }
  else {
    local_d0 = Symbol::GetScope(sym);
  }
  recList._40_8_ = local_d0;
  if (local_d0 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1073,"(symScope)","symScope");
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  if ((pid_local == (IdentPtr)0x0) ||
     (bVar5 = Symbol::GetIsModuleExportStorage((Symbol *)pid_local), !bVar5)) {
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)local_88,this->alloc,4);
    while (symScope = FindScopeForSym(this,(Scope *)recList._40_8_,symScope,(PropertyId *)&scope,
                                      _thisLocation), symScope != this->globalScope) {
      if ((symScope != (Scope *)recList._40_8_) && (scope._4_4_ == 0xffffffff)) {
        scope._4_4_ = FuncInfo::AcquireTmpRegister(_thisLocation);
      }
      pFVar4 = _thisLocation;
      if ((int)scope == -1) {
        pFVar13 = Scope::GetFunc(symScope);
        if (pFVar4 != pFVar13) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x1094,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()"
                            );
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        instLocation = Scope::GetLocation(symScope);
      }
      if (symScope == (Scope *)recList._40_8_) break;
      if ((symScope == (Scope *)0x0) || (bVar5 = Scope::GetIsDynamic(symScope), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x109e,"(scope && scope->GetIsDynamic())",
                           "scope && scope->GetIsDynamic()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar5 = Scope::GetIsObject(symScope);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x109f,"(scope->GetIsObject())","scope->GetIsObject()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      DynamicLoadRecord::DynamicLoadRecord((DynamicLoadRecord *)&propertyIndex);
      propertyId = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      if (pid_local == (IdentPtr)0x0) {
        local_108 = Ident::GetPropertyId((Ident *)pThisLocation_local);
      }
      else {
        local_108 = Symbol::EnsurePosition((Symbol *)pid_local,this);
      }
      uVar9 = FuncInfo::FindOrAddReferencedPropertyId(_thisLocation,local_108);
      SVar6 = Scope::GetScopeType(symScope);
      iVar11 = (int)scope;
      if (SVar6 == ScopeType_With) {
        if (envIndex == -1) {
          envIndex = FuncInfo::AcquireTmpRegister(_thisLocation);
        }
        iVar11 = (int)scope;
        if ((int)scope == -1) {
          Js::ByteCodeWriter::BrProperty
                    (&this->m_writer,BrOnHasProperty,propertyId,instLocation,uVar9);
          propertyIndex = 3;
          rec.kind = instLocation;
        }
        else {
          uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
          DVar7 = iVar11 + (uVar8 >> 3);
          Js::ByteCodeWriter::BrEnvProperty
                    (&this->m_writer,BrOnHasEnvProperty,propertyId,uVar9,DVar7);
          propertyIndex = 4;
          rec.kind = DVar7;
        }
      }
      else if ((int)scope == -1) {
        Js::ByteCodeWriter::BrLocalProperty(&this->m_writer,BrOnHasLocalProperty,propertyId,uVar9);
        propertyIndex = 1;
      }
      else {
        uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
        DVar7 = iVar11 + (uVar8 >> 3);
        Js::ByteCodeWriter::BrEnvProperty
                  (&this->m_writer,BrOnHasLocalEnvProperty,propertyId,uVar9,DVar7);
        propertyIndex = 2;
        rec.kind = DVar7;
      }
      JsUtil::
      List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_88,(DynamicLoadRecord *)&propertyIndex);
    }
    if ((pid_local == (IdentPtr)0x0) || (bVar5 = Symbol::GetIsGlobal((Symbol *)pid_local), bVar5)) {
      if ((this->flags & 0x404) == 0) {
        if (scope._4_4_ == 0xffffffff) {
          scope._4_4_ = 0xfffffffd;
        }
        else {
          Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,scope._4_4_,0xfffffffd);
        }
        if (envIndex == -1) {
          envIndex = _thisLocation->undefinedConstantRegister;
        }
        else {
          Js::ByteCodeWriter::Reg2
                    (&this->m_writer,Ld_A,envIndex,_thisLocation->undefinedConstantRegister);
        }
      }
      else {
        if (scope._4_4_ == 0xffffffff) {
          scope._4_4_ = FuncInfo::AcquireTmpRegister(_thisLocation);
        }
        if (pid_local == (IdentPtr)0x0) {
          local_140 = Ident::GetPropertyId((Ident *)pThisLocation_local);
        }
        else {
          local_140 = Symbol::EnsurePosition((Symbol *)pid_local,this);
        }
        if (envIndex == -1) {
          envIndex = FuncInfo::AcquireTmpRegister(_thisLocation);
        }
        RVar10 = scope._4_4_;
        uVar9 = FuncInfo::FindOrAddReferencedPropertyId(_thisLocation,local_140);
        Js::ByteCodeWriter::ScopedProperty2(&this->m_writer,ScopedLdInst,RVar10,uVar9,envIndex);
      }
    }
    else if (scope._4_4_ != 0xffffffff) {
      if ((int)scope == -1) {
        bVar5 = Scope::HasInnerScopeIndex(symScope);
        RVar10 = scope._4_4_;
        uVar2 = recList._40_8_;
        if (bVar5) {
          uVar9 = Scope::GetInnerScopeIndex(symScope);
          Js::ByteCodeWriter::Reg1Unsigned1(&this->m_writer,LdInnerScope,RVar10,uVar9);
        }
        else {
          pSVar14 = FuncInfo::GetParamScope(_thisLocation);
          uVar3 = recList._40_8_;
          if ((Scope *)uVar2 == pSVar14) {
            if ((_thisLocation->frameObjRegister == 0xffffffff) ||
               (bVar5 = FuncInfo::IsBodyAndParamScopeMerged(_thisLocation), bVar5)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1117,
                                 "(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged())"
                                 ,
                                 "funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged()"
                                );
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            Js::ByteCodeWriter::Reg1(&this->m_writer,LdParamObj,scope._4_4_);
          }
          else {
            pSVar14 = FuncInfo::GetBodyScope(_thisLocation);
            if ((Scope *)uVar3 == pSVar14) {
              if (_thisLocation->frameObjRegister == 0xffffffff) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                   ,0x1120,
                                   "(funcInfo->frameObjRegister != Js::Constants::NoRegister)",
                                   "funcInfo->frameObjRegister != Js::Constants::NoRegister");
                if (!bVar5) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
              Js::ByteCodeWriter::Reg1(&this->m_writer,LdLocalObj,scope._4_4_);
            }
            else {
              Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,scope._4_4_,instLocation);
            }
          }
        }
      }
      else {
        bVar5 = Scope::GetIsObject(symScope);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x110d,"(scope->GetIsObject())","scope->GetIsObject()");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        RVar10 = scope._4_4_;
        iVar11 = (int)scope;
        uVar8 = Js::FrameDisplay::GetOffsetOfScopes();
        Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar10,iVar11 + (uVar8 >> 3));
      }
      if (envIndex == -1) {
        envIndex = _thisLocation->undefinedConstantRegister;
      }
      else {
        Js::ByteCodeWriter::Reg2
                  (&this->m_writer,Ld_A,envIndex,_thisLocation->undefinedConstantRegister);
      }
    }
    bVar5 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::Empty
                      ((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_88);
    if (!bVar5) {
      if (scope._4_4_ == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1130,"(instLocation != Js::Constants::NoRegister)",
                           "instLocation != Js::Constants::NoRegister");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      if (envIndex == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1131,"(thisLocation != Js::Constants::NoRegister)",
                           "thisLocation != Js::Constants::NoRegister");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      labelID = Js::ByteCodeWriter::DefineLabel(&this->m_writer);
      Js::ByteCodeWriter::Br(&this->m_writer,labelID);
      local_bc = 0;
      while( true ) {
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_88,local_bc);
        Js::ByteCodeWriter::MarkLabel(&this->m_writer,pTVar15->label);
        pTVar15 = JsUtil::
                  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)local_88,local_bc);
        RVar10 = scope._4_4_;
        switch(pTVar15->kind) {
        case Local:
          Js::ByteCodeWriter::Reg1(&this->m_writer,LdLocalObj_ReuseLoc,scope._4_4_);
          if (envIndex != _thisLocation->undefinedConstantRegister) {
            if (envIndex == scope._4_4_) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x113f,"(thisLocation != instLocation)",
                                 "thisLocation != instLocation");
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            Js::ByteCodeWriter::Reg2
                      (&this->m_writer,Ld_A_ReuseLoc,envIndex,
                       _thisLocation->undefinedConstantRegister);
          }
          break;
        case Env:
          pTVar15 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_88,local_bc);
          Js::ByteCodeWriter::SlotI1
                    (&this->m_writer,LdEnvObj_ReuseLoc,RVar10,(pTVar15->field_2).index);
          if (envIndex != _thisLocation->undefinedConstantRegister) {
            if (envIndex == scope._4_4_) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1148,"(thisLocation != instLocation)",
                                 "thisLocation != instLocation");
              if (!bVar5) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar12 = 0;
            }
            Js::ByteCodeWriter::Reg2
                      (&this->m_writer,Ld_A_ReuseLoc,envIndex,
                       _thisLocation->undefinedConstantRegister);
          }
          break;
        case LocalWith:
          pTVar15 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_88,local_bc);
          Js::ByteCodeWriter::Reg2
                    (&this->m_writer,UnwrapWithObj_ReuseLoc,RVar10,(pTVar15->field_2).instance);
          R0 = envIndex;
          pTVar15 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_88,local_bc);
          Js::ByteCodeWriter::Reg2
                    (&this->m_writer,UnwrapWithObj_ReuseLoc,R0,(pTVar15->field_2).instance);
          break;
        case EnvWith:
          RVar10 = FuncInfo::AcquireTmpRegister(_thisLocation);
          pTVar15 = JsUtil::
                    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            *)local_88,local_bc);
          Js::ByteCodeWriter::SlotI1(&this->m_writer,LdEnvObj,RVar10,(pTVar15->field_2).index);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj_ReuseLoc,scope._4_4_,RVar10);
          Js::ByteCodeWriter::Reg2(&this->m_writer,UnwrapWithObj_ReuseLoc,envIndex,RVar10);
          FuncInfo::ReleaseTmpRegister(_thisLocation,RVar10);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x115d,"((0))","(0)");
          if (!bVar5) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        iVar11 = JsUtil::ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>::
                 Count((ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer> *)
                       local_88);
        if (local_bc == iVar11 + -1) break;
        Js::ByteCodeWriter::Br(&this->m_writer,labelID);
        local_bc = local_bc + 1;
      }
      Js::ByteCodeWriter::MarkLabel(&this->m_writer,labelID);
    }
    *pInstLocation_local = envIndex;
    funcInfo_local->inlineCacheCount = scope._4_4_;
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_88);
  }
  else {
    funcInfo_local->inlineCacheCount = 0xffffffff;
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitLoadInstance(Symbol *sym, IdentPtr pid, Js::RegSlot *pThisLocation, Js::RegSlot *pInstLocation, FuncInfo *funcInfo)
{
    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::RegSlot thisLocation = *pThisLocation;
    Js::RegSlot instLocation = *pInstLocation;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym != nullptr && sym->GetIsModuleExportStorage())
    {
        *pInstLocation = Js::Constants::NoRegister;
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            break;
        }

        if (scope != symScope)
        {
            // We're not sure where the function is (eval/with/etc).
            // So we're going to need registers to hold the instance where we (dynamically) find
            // the function, and possibly to hold the "this" pointer we will pass to it.
            // Assign them here so that they can't overlap with the scopeLocation assigned below.
            // Otherwise we wind up with temp lifetime confusion in the IRBuilder. (Win8 281689)
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }
        }

        if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        // Record dynamic scopes, in order. Define a label for each one. Remember whether we've seen a 'with'.
        // For each dynamic scope, emit BrOnHas[Env,Local]Property $Ln, where n is the scope's position in the list
        // Then emit code for default access (i.e., static binding). If no 'with', do not create a temp for 'this', just use 'undefined'.
        // End static portion with 'Br $Ldone'.
        // Then, for each item in list, emit:
        // $Ln:
        //     copy dynamic scope to 'instance' temp, using 'reuse_loc' form of the opcode
        //     do the same for 'this' temp', only if we've seen a 'with'
        //     if not the last item in the list, Br $Ldone

        DynamicLoadRecord rec;
            
        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                // The local body scope. Branch cannot bail on implicit calls.
              
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
            }
            else
            {
                // Function body scope in an enclosing function that calls eval.
                // Emit a branch opcode that does not require bail on implicit calls.

                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }

            if (envIndex == -1)
            {
                // With object declared in this function. HasProperty may have implicit calls.
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                // With object declared in an enclosing function. HasProperty may have implicit calls.
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    if (sym == nullptr || sym->GetIsGlobal())
    {
        if (this->flags & (fscrEval | fscrImplicitThis))
        {
            // Load of a symbol with unknown scope from within eval.
            // Get it from the closure environment.
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = funcInfo->AcquireTmpRegister();
            }

            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->AcquireTmpRegister();
            }
            this->m_writer.ScopedProperty2(Js::OpCode::ScopedLdInst, instLocation,
                funcInfo->FindOrAddReferencedPropertyId(propertyId), thisLocation);
        }
        else
        {
            if (instLocation == Js::Constants::NoRegister)
            {
                instLocation = ByteCodeGenerator::RootObjectRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, ByteCodeGenerator::RootObjectRegister);
            }

            if (thisLocation == Js::Constants::NoRegister)
            {
                thisLocation = funcInfo->undefinedConstantRegister;
            }
            else
            {
                this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
            }
        }
    }
    else if (instLocation != Js::Constants::NoRegister)
    {
        if (envIndex != -1)
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation,
                envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var));
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.Reg1Unsigned1(Js::OpCode::LdInnerScope, instLocation, scope->GetInnerScopeIndex());
        }
        else if (symScope == funcInfo->GetParamScope())
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister && !funcInfo->IsBodyAndParamScopeMerged());
            this->m_writer.Reg1(Js::OpCode::LdParamObj, instLocation);
        }
        else if (symScope != funcInfo->GetBodyScope())
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, instLocation, scopeLocation);
        }
        else
        {
            Assert(funcInfo->frameObjRegister != Js::Constants::NoRegister);
            this->m_writer.Reg1(Js::OpCode::LdLocalObj, instLocation);
        }

        if (thisLocation != Js::Constants::NoRegister)
        {
            this->m_writer.Reg2(Js::OpCode::Ld_A, thisLocation, funcInfo->undefinedConstantRegister);
        }
        else
        {
            thisLocation = funcInfo->undefinedConstantRegister;
        }
    }

    if (!recList.Empty())
    {
        Assert(instLocation != Js::Constants::NoRegister);
        Assert(thisLocation != Js::Constants::NoRegister);

        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->m_writer.Reg1(Js::OpCode::LdLocalObj_ReuseLoc, instLocation);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::Env:
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj_ReuseLoc, instLocation, recList.Item(i).index);
                    if (thisLocation != funcInfo->undefinedConstantRegister)
                    {
                        Assert(thisLocation != instLocation);
                        this->m_writer.Reg2(Js::OpCode::Ld_A_ReuseLoc, thisLocation, funcInfo->undefinedConstantRegister);
                    }
                    break;

                case DynamicLoadKind::LocalWith:
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, recList.Item(i).instance);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, recList.Item(i).instance);
                    break;

                case DynamicLoadKind::EnvWith:
                {
                    Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, tmpReg, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, instLocation, tmpReg);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj_ReuseLoc, thisLocation, tmpReg);
                    funcInfo->ReleaseTmpRegister(tmpReg);
                    break;
                }

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }

    *pThisLocation = thisLocation;
    *pInstLocation = instLocation;
}